

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_generator.cc
# Opt level: O2

void __thiscall
t_generator::validate<t_function*>
          (t_generator *this,vector<t_function_*,_std::allocator<t_function_*>_> *list)

{
  pointer pptVar1;
  
  for (pptVar1 = (list->super__Vector_base<t_function_*,_std::allocator<t_function_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar1 !=
      (list->super__Vector_base<t_function_*,_std::allocator<t_function_*>_>)._M_impl.
      super__Vector_impl_data._M_finish; pptVar1 = pptVar1 + 1) {
    (*this->_vptr_t_generator[0xe])(this,*pptVar1);
  }
  return;
}

Assistant:

void t_generator::validate(const vector<T>& list) const{
  typename vector<T>::const_iterator it;
  for(it=list.begin(); it != list.end(); ++it) {
      validate(*it);
  }
}